

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O0

int32_t trng::int_math::modulo_inverse(int32_t a,int32_t m)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  int in_EDI;
  int32_t q;
  int32_t temp;
  int32_t m1;
  int32_t f;
  int32_t flast;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  runtime_error local_48 [16];
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  invalid_argument local_18 [16];
  int local_8;
  int local_4;
  
  local_8 = in_ESI;
  local_4 = in_EDI;
  if ((in_EDI < 1) || (in_ESI < 2)) {
    std::invalid_argument::invalid_argument
              (local_18,"invalid argument in trng::int_math::modulo_inverse");
    utility::throw_this<std::invalid_argument>
              ((invalid_argument *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    std::invalid_argument::~invalid_argument(local_18);
  }
  local_28 = 0;
  local_2c = 1;
  local_30 = local_8;
  while (1 < local_4) {
    local_38 = local_30 / local_4;
    iVar1 = local_4;
    local_34 = local_2c;
    iVar2 = local_28 - local_38 * local_2c;
    local_28 = local_2c;
    local_4 = local_30 % local_4;
    local_30 = iVar1;
    local_2c = iVar2;
  }
  if (local_4 == 0) {
    std::runtime_error::runtime_error(local_48,"no inverse in trng::int_math::modulo_inverse");
    utility::throw_this<std::runtime_error>
              ((runtime_error *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    std::runtime_error::~runtime_error(local_48);
  }
  if (local_2c < 0) {
    local_2c = local_2c + local_8;
  }
  return local_2c;
}

Assistant:

TRNG_CUDA_ENABLE
    inline int32_t modulo_inverse(int32_t a, int32_t m) {
#if !(defined TRNG_CUDA)
      if (a <= 0 or m <= 1)
        utility::throw_this(
            std::invalid_argument("invalid argument in trng::int_math::modulo_inverse"));
#endif
      int32_t flast{0}, f{1}, m1{m};
      while (a > 1) {
        int32_t temp{m1 % a};
        int32_t q{m1 / a};
        m1 = a;
        a = temp;
        temp = f;
        f = flast - q * f;
        flast = temp;
      }
#if !(defined TRNG_CUDA)
      if (a == 0)
        utility::throw_this(std::runtime_error("no inverse in trng::int_math::modulo_inverse"));
#endif
      return f >= 0 ? f : f + m;
    }